

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blitter_terminal.cpp
# Opt level: O2

terminal_output_type __thiscall
E64::blitter_ic::terminal_check_output(blitter_ic *this,uint8_t no,bool top_down,uint32_t *address)

{
  terminal_output_type tVar1;
  ulong uVar2;
  undefined7 in_register_00000031;
  int i;
  uint uVar3;
  
  uVar2 = CONCAT71(in_register_00000031,no) & 0xffffffff;
  tVar1 = NOTHING;
  uVar3 = 0;
  do {
    if (this->blit[uVar2].tiles <= uVar3) {
      return tVar1;
    }
    if (this->tile_ram
        [(uVar3 & 0xffff) + (int)CONCAT71(in_register_00000031,no) * 0x2000 & 0x1fffff] == ':') {
      tVar1 = ASCII;
      if (top_down) {
        return ASCII;
      }
    }
    else if ((this->tile_ram
              [(uVar3 & 0xffff) + (int)CONCAT71(in_register_00000031,no) * 0x2000 & 0x1fffff] == ';'
             ) && (tVar1 = MONITOR_WORD, top_down)) {
      return MONITOR_WORD;
    }
    uVar3 = uVar3 + this->blit[uVar2].columns;
  } while( true );
}

Assistant:

enum E64::terminal_output_type E64::blitter_ic::terminal_check_output(uint8_t no, bool top_down, uint32_t *address)
{
	enum terminal_output_type output = NOTHING;

	for (int i = 0; i < blit[no].get_tiles(); i += blit[no].get_columns()) {
		if (terminal_get_tile(no, i) == ':') {
			output = ASCII;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		} else if (terminal_get_tile(no, i) == ';') {
			output = MONITOR_WORD;
			char potential_address[7];
			for (int j=0; j<6; j++) {
				potential_address[j] = terminal_get_tile(no, i+1+j);
			}
			potential_address[6] = 0;
			//hud.hex_string_to_int(potential_address, address);
			if (top_down) break;
		}
	}
	return output;
}